

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_array_table_key_abi_cxx11_
          (result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  value_type *pvVar8;
  value_type *__x;
  internal_error *piVar9;
  syntax_error *this_00;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  location *extraout_RDX;
  location *extraout_RDX_00;
  location *loc_00;
  undefined8 ctx;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  result<toml::detail::region,_toml::detail::none_t> nl;
  result<toml::detail::region,_toml::detail::none_t> close;
  location inner_loc;
  result<toml::detail::region,_toml::detail::none_t> open;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keys;
  result<toml::detail::region,_toml::detail::none_t> token;
  allocator_type local_469;
  undefined1 local_468 [32];
  undefined1 local_448 [32];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  const_iterator local_3d8;
  const_iterator cStack_3d0;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  region local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined1 local_358 [80];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_2a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290 [4];
  location local_250;
  string local_208;
  undefined1 local_1e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  result<toml::detail::region,_toml::detail::none_t> local_118;
  result<toml::detail::region,_toml::detail::none_t> local_c8;
  result<toml::detail::region,_toml::detail::none_t> local_78;
  
  sequence<$d696dba4$>::invoke(&local_118,(location *)this);
  if (local_118.is_ok_ == true) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    pvVar8 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_118);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)local_3c8,(detail *)(pvVar8->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar8->last_)._M_current,in_RCX);
    location::location(&local_250,&local_208,(string *)local_3c8);
    if ((undefined1 *)local_3c8._0_8_ != local_3b8) {
      operator_delete((void *)local_3c8._0_8_,(long)local_3b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    sequence<toml::detail::character<'['>,_toml::detail::character<'['>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_1e8,&local_250);
    if ((local_1e8[0] != true) ||
       (local_250.iter_._M_current ==
        ((local_250.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish)) {
      piVar9 = (internal_error *)__cxa_allocate_exception(0x78);
      local_358._0_8_ = local_358 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"toml::parse_array_table_key: no `[[`","");
      source_location::source_location((source_location *)&local_180,&local_250);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[15],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_3c8,(source_location *)&local_180,(char (*) [15])"should be `[[`");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_3c8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_308,__l_00,(allocator_type *)local_448);
      local_468._0_8_ = (pointer)0x0;
      local_468._8_8_ = (pointer)0x0;
      local_468._16_8_ = (pointer)0x0;
      format_underline((string *)local_2a0,(string *)local_358,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_308,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_468,false);
      source_location::source_location((source_location *)local_428,&local_250);
      internal_error::internal_error(piVar9,(string *)local_2a0,(source_location *)local_428);
      __cxa_throw(piVar9,&internal_error::typeinfo,internal_error::~internal_error);
    }
    repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>
    ::invoke(&local_78,&local_250);
    loc_00 = extraout_RDX;
    if (local_78.is_ok_ == true) {
      region::~region(&local_78.field_1.succ.value);
      loc_00 = extraout_RDX_00;
    }
    parse_key_abi_cxx11_(&local_180,(detail *)&local_250,loc_00);
    if (local_180.is_ok_ == false) {
      piVar9 = (internal_error *)__cxa_allocate_exception(0x78);
      local_308._M_allocated_capacity = (size_type)local_2f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"toml::parse_array_table_key: invalid key","");
      source_location::source_location((source_location *)local_428,&local_250);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[10],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_3c8,(source_location *)local_428,(char (*) [10])"not a key");
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_3c8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_468,__l_01,(allocator_type *)&local_2b8);
      local_448._0_8_ = (pointer)0x0;
      local_448._8_8_ = (pointer)0x0;
      local_448._16_8_ = (pointer)0x0;
      format_underline((string *)local_358,(string *)&local_308,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_468,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_448,false);
      source_location::source_location((source_location *)local_2a0,&local_250);
      internal_error::internal_error(piVar9,(string *)local_358,(source_location *)local_2a0);
      __cxa_throw(piVar9,&internal_error::typeinfo,internal_error::~internal_error);
    }
    repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>
    ::invoke(&local_c8,&local_250);
    if (local_c8.is_ok_ == true) {
      region::~region(&local_c8.field_1.succ.value);
    }
    sequence<toml::detail::character<']'>,_toml::detail::character<']'>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_2a0,&local_250);
    if (local_2a0[0] == (string)0x0) {
      piVar9 = (internal_error *)__cxa_allocate_exception(0x78);
      local_468._0_8_ = local_468 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"toml::parse_array_table_key: no `]]`","");
      source_location::source_location((source_location *)local_428,&local_250);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[15],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_3c8,(source_location *)local_428,(char (*) [15])"should be `]]`");
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_3c8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_448,__l_02,(allocator_type *)&local_198);
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)&local_308,(string *)local_468,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_448,&local_2b8,false);
      source_location::source_location((source_location *)local_358,&local_250);
      internal_error::internal_error(piVar9,(string *)&local_308,(source_location *)local_358);
      __cxa_throw(piVar9,&internal_error::typeinfo,internal_error::~internal_error);
    }
    if (*(long *)(this + 0x40) != *(long *)(*(long *)(this + 8) + 8)) {
      sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::maybe<toml::detail::sequence<toml::detail::character<'#'>,_toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::character<'\t'>,_toml::detail::in_range<'_',_'~'>_>,_toml::detail::sequence<toml::detail::in_range<'\xc2',_'\xdf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xe0'>,_toml::detail::in_range<'\xa0',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xf0'>,_toml::detail::in_range<'\x90',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xf1',_'\xf3'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xf4'>,_toml::detail::in_range<'\x80',_'\x8f'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::unlimited>_>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>
      ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_428,(location *)this);
      if (local_428[0] == false) {
        this_00 = (syntax_error *)__cxa_allocate_exception(0x78);
        local_448._0_8_ = local_448 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "toml::parse_array_table_key: newline required after [[table.key]]","");
        source_location::source_location((source_location *)local_358,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[17],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_3c8,(source_location *)local_358,(char (*) [17])"expected newline");
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)local_3c8;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_2b8,__l_03,&local_469);
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline((string *)local_468,(string *)local_448,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2b8,&local_198,false);
        source_location::source_location((source_location *)&local_308,(location *)this);
        syntax_error::syntax_error(this_00,(string *)local_468,(source_location *)&local_308);
        __cxa_throw(this_00,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
      region::~region((region *)(local_428 + 8));
    }
    __x = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::unwrap(&local_180);
    pvVar8 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_118);
    std::
    pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
    ::pair<toml::detail::region_&,_true>
              ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                *)local_428,&__x->first,pvVar8);
    uVar7 = local_408[1]._8_8_;
    uVar6 = local_408[0]._8_8_;
    uVar5 = local_408[0]._M_allocated_capacity;
    uVar4 = local_418._0_8_;
    uVar3 = local_428._8_8_;
    uVar2 = local_428._0_8_;
    local_3b0.source_name_._M_dataplus._M_p = (pointer)&local_3b0.source_name_.field_2;
    local_428._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_428._8_8_ = (_func_int **)0x0;
    local_418._0_8_ = (element_type *)0x0;
    local_3b0.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001c5698;
    local_408[0]._M_allocated_capacity = (pointer)0x0;
    local_408[0]._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ctx = local_408[1]._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408[1]._0_8_ == &local_3e8) {
      local_3b0.source_name_.field_2._8_8_ = local_3e8._8_8_;
      ctx = local_3b0.source_name_._M_dataplus._M_p;
    }
    local_3b0.source_name_.field_2._M_allocated_capacity._1_7_ =
         local_3e8._M_allocated_capacity._1_7_;
    local_3b0.source_name_.field_2._M_local_buf[0] = local_3e8._M_local_buf[0];
    local_408[1]._8_8_ = 0;
    local_3e8._M_local_buf[0] = '\0';
    local_3b0.first_._M_current = local_3d8._M_current;
    local_3b0.last_._M_current = cStack_3d0._M_current;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar2;
    (__return_storage_ptr__->field_1).succ.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar3;
    (__return_storage_ptr__->field_1).succ.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar4;
    local_3b8 = (undefined1  [8])0x0;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)&PTR__region_001c5698;
    local_3b0.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar5;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    local_3b0.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
    (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
         (pointer)paVar1;
    if ((pointer)ctx == local_3b0.source_name_._M_dataplus._M_p) {
      paVar1->_M_allocated_capacity = local_3b0.source_name_.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8) =
           local_3b0.source_name_.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
           (pointer)ctx;
      (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2._M_allocated_capacity
           = local_3b0.source_name_.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length = uVar7;
    local_3b0.source_name_._M_string_length = 0;
    local_3b0.source_name_.field_2._M_allocated_capacity =
         (ulong)(uint7)local_3e8._M_allocated_capacity._1_7_ << 8;
    (__return_storage_ptr__->field_1).succ.value.second.first_._M_current = local_3d8._M_current;
    (__return_storage_ptr__->field_1).succ.value.second.last_._M_current = cStack_3d0._M_current;
    local_408[1]._0_8_ = &local_3e8;
    region::~region(&local_3b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3c8);
    region::~region((region *)(local_418 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_428);
    if (local_2a0[0] == (string)0x1) {
      region::~region((region *)(local_2a0 + 8));
    }
    result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup(&local_180,(EVP_PKEY_CTX *)ctx);
    if (local_1e8[0] == true) {
      region::~region((region *)(local_1e8 + 8));
    }
    location::~location(&local_250);
  }
  else {
    local_2a0._0_8_ = local_290;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a0,"toml::parse_array_table_key: not a valid table key","");
    source_location::source_location((source_location *)&local_180,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[5],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3c8,(source_location *)&local_180,(char (*) [5])0x187401);
    __l._M_len = 1;
    __l._M_array = (iterator)local_3c8;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_358,__l,(allocator_type *)&local_250);
    local_308._M_allocated_capacity = 0;
    local_308._8_8_ = 0;
    local_2f8[0]._M_allocated_capacity = 0;
    format_underline((string *)local_1e8,(string *)local_2a0,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_358,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_308,false);
    uVar2 = local_1e8._8_8_;
    local_428._0_8_ = local_418;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_ ==
        local_1d8) {
      local_418._8_8_ = local_1d8[0]._M_string_length;
      local_1e8._0_8_ = local_428._0_8_;
    }
    local_418._1_7_ = local_1d8[0]._M_dataplus._M_p._1_7_;
    local_418[0] = local_1d8[0]._M_dataplus._M_p._0_1_;
    local_1e8._8_8_ = (_func_int **)0x0;
    local_1d8[0]._M_dataplus._M_p._0_1_ = '\0';
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    (__return_storage_ptr__->field_1).succ.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar1;
    if (local_1e8._0_8_ == local_428._0_8_) {
      paVar1->_M_allocated_capacity = local_418._0_8_;
      (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
           (_func_int **)local_418._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1e8._0_8_;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_418._0_8_;
    }
    (__return_storage_ptr__->field_1).succ.value.first.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar2;
    local_428._8_8_ = (_func_int **)0x0;
    local_418._0_8_ = (ulong)(uint7)local_1d8[0]._M_dataplus._M_p._1_7_ << 8;
    local_1e8._0_8_ = local_1d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_308);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.first_._M_current != &local_368) {
      operator_delete(local_3b0.first_._M_current,local_368._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_3c8);
    source_location::~source_location((source_location *)&local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._0_8_ != local_290) {
      operator_delete((void *)local_2a0._0_8_,(ulong)(local_290[0]._M_allocated_capacity + 1));
    }
  }
  if (local_118.is_ok_ == true) {
    region::~region(&local_118.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<std::vector<key>, region>, std::string>
parse_array_table_key(location& loc)
{
    if(auto token = lex_array_table::invoke(loc))
    {
        location inner_loc(loc.name(), token.unwrap().str());

        const auto open = lex_array_table_open::invoke(inner_loc);
        if(!open || inner_loc.iter() == inner_loc.end())
        {
            throw internal_error(format_underline(
                "toml::parse_array_table_key: no `[[`",
                {{source_location(inner_loc), "should be `[[`"}}),
                source_location(inner_loc));
        }
        lex_ws::invoke(inner_loc);
        const auto keys = parse_key(inner_loc);
        if(!keys)
        {
            throw internal_error(format_underline(
                "toml::parse_array_table_key: invalid key",
                {{source_location(inner_loc), "not a key"}}),
                source_location(inner_loc));
        }
        lex_ws::invoke(inner_loc);
        const auto close = lex_array_table_close::invoke(inner_loc);
        if(!close)
        {
            throw internal_error(format_underline(
                "toml::parse_array_table_key: no `]]`",
                {{source_location(inner_loc), "should be `]]`"}}),
                source_location(inner_loc));
        }

        // after [[table.key]], newline or EOF(empty table) required.
        if(loc.iter() != loc.end())
        {
            using lex_newline_after_table_key =
                sequence<maybe<lex_ws>, maybe<lex_comment>, lex_newline>;
            const auto nl = lex_newline_after_table_key::invoke(loc);
            if(!nl)
            {
                throw syntax_error(format_underline("toml::"
                    "parse_array_table_key: newline required after [[table.key]]",
                    {{source_location(loc), "expected newline"}}),
                    source_location(loc));
            }
        }
        return ok(std::make_pair(keys.unwrap().first, token.unwrap()));
    }
    else
    {
        return err(format_underline("toml::parse_array_table_key: "
            "not a valid table key", {{source_location(loc), "here"}}));
    }
}